

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::ArrayWithPreallocation<soul::Structure::Member,_8UL>::reserve
          (ArrayWithPreallocation<soul::Structure::Member,_8UL> *this,size_t minSize)

{
  unsigned_long uVar1;
  Member *pMVar2;
  ulong local_28;
  size_t i;
  Member *newObjects;
  size_t minSize_local;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *this_local;
  
  if (this->numAllocated < minSize) {
    uVar1 = getAlignedSize<16,unsigned_long>(minSize);
    if (8 < uVar1) {
      pMVar2 = (Member *)operator_new__(uVar1 << 6);
      for (local_28 = 0; local_28 < this->numActive; local_28 = local_28 + 1) {
        Structure::Member::Member(pMVar2 + local_28,this->items + local_28);
        Structure::Member::~Member(this->items + local_28);
      }
      freeIfHeapAllocated(this);
      this->items = pMVar2;
    }
    this->numAllocated = uVar1;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }